

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrittenFontCFF.cpp
# Opt level: O2

bool __thiscall
WrittenFontCFF::HasEnoughSpaceForGlyphs
          (WrittenFontCFF *this,GlyphUnicodeMappingListList *inGlyphsList)

{
  iterator iVar1;
  int iVar2;
  _List_node_base *p_Var3;
  uint local_3c;
  _List_node_base *local_38;
  
  iVar2 = 0;
  local_38 = (_List_node_base *)inGlyphsList;
  while (inGlyphsList = (GlyphUnicodeMappingListList *)
                        (((_List_base<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
                           *)&((_List_node_base *)inGlyphsList)->_M_next)->_M_impl)._M_node.
                        super__List_node_base._M_next, (_List_node_base *)inGlyphsList != local_38)
  {
    p_Var3 = (_List_node_base *)((long)inGlyphsList + 0x10);
    while (p_Var3 = p_Var3->_M_next, p_Var3 != (_List_node_base *)((long)inGlyphsList + 0x10)) {
      local_3c = (uint)*(ushort *)((long)(p_Var3 + 2) + 8);
      iVar1 = std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_GlyphEncodingInfo>,_std::_Select1st<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>_>
              ::find((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_GlyphEncodingInfo>,_std::_Select1st<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>_>
                      *)(this->super_AbstractWrittenFont).mANSIRepresentation,&local_3c);
      iVar2 = iVar2 + (uint)((_Rb_tree_header *)iVar1._M_node ==
                            &(((this->super_AbstractWrittenFont).mANSIRepresentation)->
                             mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header);
    }
  }
  return iVar2 <= (int)(uint)this->mAvailablePositionsCount;
}

Assistant:

bool WrittenFontCFF::HasEnoughSpaceForGlyphs(const GlyphUnicodeMappingListList& inGlyphsList)
{
	GlyphUnicodeMappingListList::const_iterator itList = inGlyphsList.begin();
	GlyphUnicodeMappingList::const_iterator it;
	int glyphsToAddCount = 0;

	for(; itList != inGlyphsList.end(); ++itList)
	{
		it = itList->begin();
		for(; it != itList->end(); ++it)
			if(mANSIRepresentation->mGlyphIDToEncodedChar.find(it->mGlyphCode) == mANSIRepresentation->mGlyphIDToEncodedChar.end())
				++glyphsToAddCount;
	}

	return glyphsToAddCount <= mAvailablePositionsCount;
}